

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkSetMaxConvFails(void *arkode_mem,int maxncf)

{
  int in_ESI;
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetMaxConvFails","arkode_mem = NULL illegal.")
    ;
    local_4 = -0x15;
  }
  else {
    if (in_ESI < 1) {
      *(undefined4 *)(in_RDI + 0x1cc) = 10;
    }
    else {
      *(int *)(in_RDI + 0x1cc) = in_ESI;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkSetMaxConvFails(void *arkode_mem, int maxncf)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxConvFails", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* argument <= 0 sets default, otherwise set input */
  if (maxncf <= 0) {
    ark_mem->maxncf = MAXNCF;
  } else {
    ark_mem->maxncf = maxncf;
  }
  return(ARK_SUCCESS);
}